

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O0

REF_STATUS ref_cavity_conforming(REF_CAVITY ref_cavity,REF_INT seg,REF_BOOL *conforming)

{
  REF_GRID ref_grid_00;
  REF_NODE ref_node_00;
  REF_GEOM ref_geom_00;
  REF_STATUS RVar1;
  REF_INT local_e8;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL area;
  REF_DBL uv_area;
  REF_DBL sign_uv_area;
  REF_DBL normdev;
  REF_INT nodes [27];
  REF_INT node;
  REF_GEOM ref_geom;
  REF_NODE ref_node;
  REF_GRID ref_grid;
  REF_BOOL *conforming_local;
  REF_INT seg_local;
  REF_CAVITY ref_cavity_local;
  
  ref_grid_00 = ref_cavity->ref_grid;
  ref_node_00 = ref_grid_00->node;
  ref_geom_00 = ref_grid_00->geom;
  if (ref_cavity->surf_node == -1) {
    local_e8 = ref_cavity->node;
  }
  else {
    local_e8 = ref_cavity->surf_node;
  }
  *conforming = 0;
  normdev._0_4_ = ref_cavity->s2n[seg * 3];
  normdev._4_4_ = ref_cavity->s2n[seg * 3 + 1];
  nodes[0] = local_e8;
  nodes[1] = ref_cavity->s2n[seg * 3 + 2];
  RVar1 = ref_geom_tri_norm_deviation(ref_grid_00,(REF_INT *)&normdev,&sign_uv_area);
  if (RVar1 == 0) {
    if (ref_cavity->min_normdev < sign_uv_area) {
      ref_cavity_local._4_4_ =
           ref_node_tri_area(ref_node_00,(REF_INT *)&normdev,
                             (REF_DBL *)&ref_private_macro_code_rss_1);
      if (ref_cavity_local._4_4_ == 0) {
        if (ref_node_00->min_volume < _ref_private_macro_code_rss_1) {
          if (ref_geom_00->meshlink == (void *)0x0) {
            ref_cavity_local._4_4_ = ref_geom_uv_area(ref_geom_00,(REF_INT *)&normdev,&area);
            if (ref_cavity_local._4_4_ == 0) {
              ref_cavity_local._4_4_ = ref_geom_uv_area_sign(ref_grid_00,nodes[1],&uv_area);
              if (ref_cavity_local._4_4_ == 0) {
                if (ref_node_00->min_uv_area < uv_area * area) {
                  *conforming = 1;
                  ref_cavity_local._4_4_ = 0;
                }
                else {
                  ref_cavity_local._4_4_ = 0;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0x708,"ref_cavity_conforming",(ulong)ref_cavity_local._4_4_,"sign");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x707,"ref_cavity_conforming",(ulong)ref_cavity_local._4_4_,"uv area");
            }
          }
          else {
            *conforming = 1;
            ref_cavity_local._4_4_ = 0;
          }
        }
        else {
          if (ref_cavity->debug != 0) {
            printf("cav confrom area %e lim %e\n",_ref_private_macro_code_rss_1,
                   ref_node_00->min_volume);
          }
          ref_cavity_local._4_4_ = 0;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x6fa,"ref_cavity_conforming",(ulong)ref_cavity_local._4_4_,"vol");
      }
    }
    else {
      ref_cavity_local._4_4_ = 0;
    }
  }
  else {
    *conforming = 0;
    ref_cavity_local._4_4_ = 0;
  }
  return ref_cavity_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_conforming(REF_CAVITY ref_cavity, REF_INT seg,
                                         REF_BOOL *conforming) {
  REF_GRID ref_grid = ref_cavity_grid(ref_cavity);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL normdev;
  REF_DBL sign_uv_area, uv_area, area;

  node = ref_cavity_seg_node(ref_cavity);

  *conforming = REF_FALSE;

  nodes[0] = ref_cavity_s2n(ref_cavity, 0, seg);
  nodes[1] = ref_cavity_s2n(ref_cavity, 1, seg);
  nodes[2] = node;
  nodes[3] = ref_cavity_s2n(ref_cavity, 2, seg);

  if (REF_SUCCESS != ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev)) {
    *conforming = REF_FALSE;
    return REF_SUCCESS;
  }
  if (normdev <= ref_cavity_min_normdev(ref_cavity)) return REF_SUCCESS;

  /* for twod, should not hurt 3D */
  RSS(ref_node_tri_area(ref_node, nodes, &area), "vol");
  if (area <= ref_node_min_volume(ref_node)) {
    if (ref_cavity_debug(ref_cavity))
      printf("cav confrom area %e lim %e\n", area,
             ref_node_min_volume(ref_node));
    return REF_SUCCESS;
  }

  if (ref_geom_meshlinked(ref_geom)) {
    *conforming = REF_TRUE;
    return REF_SUCCESS;
  }

  RSS(ref_geom_uv_area(ref_geom, nodes, &uv_area), "uv area");
  RSS(ref_geom_uv_area_sign(ref_grid, nodes[3], &sign_uv_area), "sign");
  uv_area *= sign_uv_area;

  if (uv_area <= ref_node_min_uv_area(ref_node)) return REF_SUCCESS;

  *conforming = REF_TRUE;

  return REF_SUCCESS;
}